

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

bool cmDependsFortran::CopyModule
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  ostream *poVar5;
  bool bVar6;
  string *destination;
  string mod_lower;
  string mod_upper;
  string mod_dir;
  string compilerId;
  string stamp;
  string mod;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  char *local_b0;
  undefined8 local_a8;
  char local_a0;
  undefined7 uStack_9f;
  string local_90;
  string local_70;
  string local_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = pbVar2[2]._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = pbVar2[3]._M_dataplus._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + pbVar2[3]._M_string_length);
  local_b0 = &local_a0;
  local_a8 = 0;
  local_a0 = '\0';
  if (0x80 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)) {
    std::__cxx11::string::_M_assign((string *)&local_b0);
  }
  cmsys::SystemTools::GetFilenamePath(&local_d0,&local_70);
  if (local_d0._M_string_length != 0) {
    std::__cxx11::string::append((char *)&local_d0);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_d0._M_dataplus._M_p,
             local_d0._M_dataplus._M_p + local_d0._M_string_length);
  cmsys::SystemTools::GetFilenameName(&local_f0,&local_70);
  cmsys::SystemTools::UpperCase(&local_130,&local_f0);
  std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_130._M_dataplus._M_p);
  paVar1 = &local_130.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_d0._M_dataplus._M_p,
             local_d0._M_dataplus._M_p + local_d0._M_string_length);
  cmsys::SystemTools::GetFilenameName(&local_50,&local_70);
  cmsys::SystemTools::LowerCase(&local_f0,&local_50);
  std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_70);
  std::__cxx11::string::append((char *)&local_110);
  destination = &local_130;
  std::__cxx11::string::append((char *)destination);
  bVar4 = cmsys::SystemTools::FileExists(local_110._M_dataplus._M_p,true);
  if (bVar4) {
    bVar4 = ModulesDiffer(local_110._M_dataplus._M_p,local_90._M_dataplus._M_p,local_b0);
    bVar6 = true;
    if (!bVar4) goto LAB_0050bb1e;
    destination = &local_90;
    bVar4 = cmsys::SystemTools::CopyFileAlways(&local_110,destination);
    if (bVar4) goto LAB_0050bb1e;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error copying Fortran module from \"",0x23);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_110._M_dataplus._M_p,local_110._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" to \"",6);
  }
  else {
    bVar4 = cmsys::SystemTools::FileExists(local_130._M_dataplus._M_p,true);
    if (bVar4) {
      bVar4 = ModulesDiffer(local_130._M_dataplus._M_p,local_90._M_dataplus._M_p,local_b0);
      bVar6 = true;
      if (!bVar4) goto LAB_0050bb1e;
      destination = &local_90;
      bVar4 = cmsys::SystemTools::CopyFileAlways(&local_130,destination);
      if (bVar4) goto LAB_0050bb1e;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error copying Fortran module from \"",0x23);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_130._M_dataplus._M_p,
                          local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" to \"",6);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error copying Fortran module \"",0x1e);
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,pbVar2[2]._M_dataplus._M_p,
                          pbVar2[2]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".  Tried \"",0xb);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_110._M_dataplus._M_p,local_110._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" and \"",7);
    }
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(destination->_M_dataplus)._M_p,destination->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".\n",3);
  bVar6 = false;
LAB_0050bb1e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool cmDependsFortran::CopyModule(const std::vector<std::string>& args)
{
  // Implements
  //
  //   $(CMAKE_COMMAND) -E cmake_copy_f90_mod input.mod output.mod.stamp
  //                                          [compiler-id]
  //
  // Note that the case of the .mod file depends on the compiler.  In
  // the future this copy could also account for the fact that some
  // compilers include a timestamp in the .mod file so it changes even
  // when the interface described in the module does not.

  std::string mod = args[2];
  std::string stamp = args[3];
  std::string compilerId;
  if (args.size() >= 5) {
    compilerId = args[4];
  }
  std::string mod_dir = cmSystemTools::GetFilenamePath(mod);
  if (!mod_dir.empty()) {
    mod_dir += "/";
  }
  std::string mod_upper = mod_dir;
  mod_upper += cmSystemTools::UpperCase(cmSystemTools::GetFilenameName(mod));
  std::string mod_lower = mod_dir;
  mod_lower += cmSystemTools::LowerCase(cmSystemTools::GetFilenameName(mod));
  mod += ".mod";
  mod_upper += ".mod";
  mod_lower += ".mod";
  if (cmSystemTools::FileExists(mod_upper.c_str(), true)) {
    if (cmDependsFortran::ModulesDiffer(mod_upper.c_str(), stamp.c_str(),
                                        compilerId.c_str())) {
      if (!cmSystemTools::CopyFileAlways(mod_upper, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_upper
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }
  if (cmSystemTools::FileExists(mod_lower.c_str(), true)) {
    if (cmDependsFortran::ModulesDiffer(mod_lower.c_str(), stamp.c_str(),
                                        compilerId.c_str())) {
      if (!cmSystemTools::CopyFileAlways(mod_lower, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_lower
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }

  std::cerr << "Error copying Fortran module \"" << args[2] << "\".  Tried \""
            << mod_upper << "\" and \"" << mod_lower << "\".\n";
  return false;
}